

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmUnaryOp(ExpressionContext *ctx,VmModule *module,ExprUnaryOp *node)

{
  SynBase *source;
  VmModule *module_00;
  bool bVar1;
  VmValue *pVVar2;
  TypeRef *structType;
  VmType VVar3;
  VmModule *this;
  SynBase *local_40;
  TypeBase *local_38;
  VmValue *local_30;
  VmValue *result;
  VmValue *value;
  ExprUnaryOp *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar2 = CompileVm(ctx,module,node->value);
  local_30 = (VmValue *)0x0;
  switch(*(undefined4 *)&(node->super_ExprBase).field_0x2c) {
  case 0:
    break;
  case 1:
    local_30 = pVVar2;
    break;
  case 2:
    local_30 = anon_unknown.dwarf_c91b1::CreateNeg(module,(node->super_ExprBase).source,pVVar2);
    break;
  case 3:
    local_30 = anon_unknown.dwarf_c91b1::CreateNot(module,(node->super_ExprBase).source,pVVar2);
    break;
  case 4:
    bVar1 = VmType::operator==(&pVVar2->type,&VmType::AutoRef);
    if (bVar1) {
      source = (node->super_ExprBase).source;
      module_00 = (VmModule *)(node->super_ExprBase).source;
      this = module;
      structType = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
      VVar3 = VmType::Pointer(&structType->super_TypeBase);
      local_40 = VVar3._0_8_;
      local_38 = VVar3.structType;
      VVar3.structType = (TypeBase *)pVVar2;
      VVar3._0_8_ = local_38;
      pVVar2 = anon_unknown.dwarf_c91b1::CreateExtract
                         ((anon_unknown_dwarf_c91b1 *)this,module_00,local_40,VVar3,(VmValue *)0x4,
                          (uint)this);
      local_30 = anon_unknown.dwarf_c91b1::CreateLogicalNot(module,source,pVVar2);
    }
    else {
      local_30 = anon_unknown.dwarf_c91b1::CreateLogicalNot
                           (module,(node->super_ExprBase).source,pVVar2);
    }
  }
  if (local_30 == (VmValue *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xb37,"VmValue *CompileVmUnaryOp(ExpressionContext &, VmModule *, ExprUnaryOp *)"
                 );
  }
  pVVar2 = anon_unknown.dwarf_c91b1::CheckType(ctx,&node->super_ExprBase,local_30);
  return pVVar2;
}

Assistant:

VmValue* CompileVmUnaryOp(ExpressionContext &ctx, VmModule *module, ExprUnaryOp *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);

	VmValue *result = NULL;

	switch(node->op)
	{
	case SYN_UNARY_OP_UNKNOWN:
		break;
	case SYN_UNARY_OP_PLUS:
		result = value;
		break;
	case SYN_UNARY_OP_NEGATE:
		result = CreateNeg(module, node->source, value);
		break;
	case SYN_UNARY_OP_BIT_NOT:
		result = CreateNot(module, node->source, value);
		break;
	case SYN_UNARY_OP_LOGICAL_NOT:
		if(value->type == VmType::AutoRef)
		{
			result = CreateLogicalNot(module, node->source, CreateExtract(module, node->source, VmType::Pointer(ctx.GetReferenceType(ctx.typeVoid)), value, 4));
		}
		else
		{
			result = CreateLogicalNot(module, node->source, value);
		}
		break;
	}

	assert(result);

	return CheckType(ctx, node, result);
}